

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_next(lua_State *L,int idx)

{
  int iVar1;
  int in_ESI;
  lua_State *in_RDI;
  int more;
  StkId t;
  undefined4 in_stack_00000018;
  lua_State *in_stack_00000028;
  
  index2adr(in_RDI,in_ESI);
  iVar1 = luaH_next(in_stack_00000028,(Table *)L,(StkId)CONCAT44(idx,in_stack_00000018));
  if (iVar1 == 0) {
    in_RDI->top = in_RDI->top + -1;
  }
  else {
    in_RDI->top = in_RDI->top + 1;
  }
  return iVar1;
}

Assistant:

static int lua_next(lua_State*L,int idx){
StkId t;
int more;
t=index2adr(L,idx);
luai_apicheck(L,ttistable(t));
more=luaH_next(L,hvalue(t),L->top-1);
if(more){
api_incr_top(L);
}
else
L->top-=1;
return more;
}